

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall
Js::InterpreterStackFrame::OP_LdLetHeapArgsCached
          (InterpreterStackFrame *this,ScriptContext *scriptContext)

{
  ArgSlot AVar1;
  JavascriptFunction *funcCallee;
  Var pvVar2;
  Var args;
  uint32 formalsCount;
  ScriptContext *scriptContext_local;
  InterpreterStackFrame *this_local;
  
  AVar1 = ParseableFunctionInfo::GetInParamsCount(*(ParseableFunctionInfo **)(this + 0x88));
  funcCallee = (JavascriptFunction *)(**(code **)(**(long **)(this + 0x80) + 0x3d0))();
  pvVar2 = Js::JavascriptOperators::LoadHeapArgsCached
                     (funcCallee,*(int *)(this + 0x18) - 1,AVar1 - 1,
                      (Var *)(*(long *)(this + 0x20) + 8),*(Var *)(this + 0x58),scriptContext,true);
  *(Var *)(this + 0x40) = pvVar2;
  return pvVar2;
}

Assistant:

Var InterpreterStackFrame::OP_LdLetHeapArgsCached(ScriptContext* scriptContext)
    {
        uint32 formalsCount = this->m_functionBody->GetInParamsCount() - 1;
        Var args = JavascriptOperators::LoadHeapArgsCached(this->function->GetRealFunctionObject(), this->m_inSlotsCount - 1, formalsCount, &this->m_inParams[1], this->localClosure, scriptContext, true);
        this->m_arguments = args;
        return args;
    }